

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O1

void rm_storage_fs(void)

{
  char cmd [64];
  char acStack_58 [72];
  
  sprintf(acStack_58,"rm -rf  %s*>errorlog.txt","e2edb_main");
  system(acStack_58);
  sprintf(acStack_58,"rm -rf  %s*>errorlog.txt","e2edb_records");
  system(acStack_58);
  return;
}

Assistant:

void rm_storage_fs()
{
    // remove previous dummy files
    int r;
    char cmd[64];

    sprintf(cmd, SHELL_DEL" %s*>errorlog.txt", E2EDB_MAIN);
    r = system(cmd);
    (void)r;

    sprintf(cmd, SHELL_DEL" %s*>errorlog.txt", E2EDB_RECORDS);
    r = system(cmd);
    (void)r;
}